

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
spirv_cross::Compiler::interface_variable_exists_in_entry_point(Compiler *this,uint32_t id)

{
  CompilerError *this_00;
  size_type sVar1;
  TypedID<(spirv_cross::Types)2> *pTVar2;
  TypedID<(spirv_cross::Types)2> *pTVar3;
  TypedID<(spirv_cross::Types)2> local_6c;
  SPIREntryPoint *local_68;
  SPIREntryPoint *execution;
  allocator local_49;
  string local_48 [32];
  SPIRVariable *local_28;
  SPIRVariable *var;
  Compiler *pCStack_18;
  uint32_t id_local;
  Compiler *this_local;
  
  var._4_4_ = id;
  pCStack_18 = this;
  local_28 = get<spirv_cross::SPIRVariable>(this,id);
  if (((local_28->storage != StorageClassInput) && (local_28->storage != StorageClassOutput)) &&
     (local_28->storage != StorageClassUniformConstant)) {
    execution._3_1_ = 1;
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_48,
               "Only Input, Output variables and Uniform constants are part of a shader linking interface."
               ,&local_49);
    CompilerError::CompilerError(this_00,(string *)local_48);
    execution._3_1_ = 0;
    __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  sVar1 = ::std::
          unordered_map<spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>_>_>
          ::size(&(this->ir).entry_points);
  if (sVar1 < 2) {
    this_local._7_1_ = true;
  }
  else {
    local_68 = get_entry_point(this);
    pTVar2 = ::std::begin<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,8ul>>
                       (&local_68->interface_variables);
    pTVar3 = ::std::end<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,8ul>>
                       (&local_68->interface_variables);
    TypedID<(spirv_cross::Types)2>::TypedID(&local_6c,var._4_4_);
    pTVar2 = ::std::
             find<spirv_cross::TypedID<(spirv_cross::Types)2>const*,spirv_cross::TypedID<(spirv_cross::Types)2>>
                       (pTVar2,pTVar3,&local_6c);
    pTVar3 = ::std::end<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,8ul>>
                       (&local_68->interface_variables);
    this_local._7_1_ = pTVar2 != pTVar3;
  }
  return this_local._7_1_;
}

Assistant:

bool Compiler::interface_variable_exists_in_entry_point(uint32_t id) const
{
	auto &var = get<SPIRVariable>(id);
	if (var.storage != StorageClassInput && var.storage != StorageClassOutput &&
	    var.storage != StorageClassUniformConstant)
		SPIRV_CROSS_THROW("Only Input, Output variables and Uniform constants are part of a shader linking interface.");

	// This is to avoid potential problems with very old glslang versions which did
	// not emit input/output interfaces properly.
	// We can assume they only had a single entry point, and single entry point
	// shaders could easily be assumed to use every interface variable anyways.
	if (ir.entry_points.size() <= 1)
		return true;

	auto &execution = get_entry_point();
	return find(begin(execution.interface_variables), end(execution.interface_variables), VariableID(id)) !=
	       end(execution.interface_variables);
}